

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O3

int dpn_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  if (operation == 3) {
    X509_NAME_free(*(X509_NAME **)(*pval + 0x10));
  }
  else if (operation == 1) {
    *(undefined8 *)(*pval + 0x10) = 0;
  }
  return 1;
}

Assistant:

static int dpn_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                  void *exarg) {
  DIST_POINT_NAME *dpn = (DIST_POINT_NAME *)*pval;

  switch (operation) {
    case ASN1_OP_NEW_POST:
      dpn->dpname = NULL;
      break;

    case ASN1_OP_FREE_POST:
      X509_NAME_free(dpn->dpname);
      break;
  }
  return 1;
}